

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *this_00;
  UnitTest *local_20;
  Environment *env_local;
  UnitTest *this_local;
  
  if (env == (Environment *)0x0) {
    this_local = (UnitTest *)0x0;
  }
  else {
    local_20 = (UnitTest *)env;
    env_local = (Environment *)this;
    this_00 = internal::UnitTestImpl::environments(this->impl_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::push_back
              (this_00,(value_type *)&local_20);
    this_local = local_20;
  }
  return (Environment *)this_local;
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == NULL) {
    return NULL;
  }

  impl_->environments().push_back(env);
  return env;
}